

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.h
# Opt level: O2

void __thiscall
pbrt::OrthographicCamera::OrthographicCamera
          (OrthographicCamera *this,CameraBaseParameters *baseParameters,Bounds2f *screenWindow,
          Float lensRadius,Float focalDistance)

{
  Transform *this_00;
  undefined8 uVar1;
  float fVar2;
  undefined1 auVar5 [56];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  Vector3<float> VVar6;
  Transform local_3f0;
  CameraBaseParameters local_370;
  
  memcpy(&local_370,baseParameters,0x340);
  local_370.film.super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits =
       (TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>)
       (baseParameters->film).super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits;
  local_370.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
           )(baseParameters->medium).
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
            .bits;
  Orthographic(&local_3f0,0.0,1.0);
  ProjectiveCamera::ProjectiveCamera
            (&this->super_ProjectiveCamera,&local_370,&local_3f0,screenWindow,lensRadius,
             focalDistance);
  (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  this_00 = &(this->super_ProjectiveCamera).cameraFromRaster;
  (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  *(undefined8 *)&(this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.z = 0;
  auVar5 = (undefined1  [56])0x0;
  local_3f0.m.m[0]._0_8_ = vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
  local_3f0.m.m[0][2] = 0.0;
  VVar6 = Transform::operator()(this_00,(Vector3<float> *)&local_3f0);
  auVar3._0_8_ = VVar6.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar3._8_56_ = auVar5;
  uVar1 = vmovlps_avx(auVar3._0_16_);
  (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  auVar5 = ZEXT856(0);
  (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.z = VVar6.super_Tuple3<pbrt::Vector3,_float>.z
  ;
  local_3f0.m.m[0][0] = 0.0;
  local_3f0.m.m[0][1] = 1.0;
  local_3f0.m.m[0][2] = 0.0;
  VVar6 = Transform::operator()(this_00,(Vector3<float> *)&local_3f0);
  auVar4._0_8_ = VVar6.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar4._8_56_ = auVar5;
  uVar1 = vmovlps_avx(auVar4._0_16_);
  (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.z = VVar6.super_Tuple3<pbrt::Vector3,_float>.z
  ;
  (this->super_ProjectiveCamera).super_CameraBase.minDirDifferentialY.
  super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  (this->super_ProjectiveCamera).super_CameraBase.minDirDifferentialY.
  super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  (this->super_ProjectiveCamera).super_CameraBase.minDirDifferentialY.
  super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  (this->super_ProjectiveCamera).super_CameraBase.minDirDifferentialX.
  super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  (this->super_ProjectiveCamera).super_CameraBase.minDirDifferentialX.
  super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  (this->super_ProjectiveCamera).super_CameraBase.minDirDifferentialX.
  super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  fVar2 = (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.y;
  (this->super_ProjectiveCamera).super_CameraBase.minPosDifferentialX.
  super_Tuple3<pbrt::Vector3,_float>.x = (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.x;
  (this->super_ProjectiveCamera).super_CameraBase.minPosDifferentialX.
  super_Tuple3<pbrt::Vector3,_float>.y = fVar2;
  (this->super_ProjectiveCamera).super_CameraBase.minPosDifferentialX.
  super_Tuple3<pbrt::Vector3,_float>.z = (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.z;
  fVar2 = (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.y;
  (this->super_ProjectiveCamera).super_CameraBase.minPosDifferentialY.
  super_Tuple3<pbrt::Vector3,_float>.x = (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.x;
  (this->super_ProjectiveCamera).super_CameraBase.minPosDifferentialY.
  super_Tuple3<pbrt::Vector3,_float>.y = fVar2;
  (this->super_ProjectiveCamera).super_CameraBase.minPosDifferentialY.
  super_Tuple3<pbrt::Vector3,_float>.z = (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.z;
  return;
}

Assistant:

OrthographicCamera(CameraBaseParameters baseParameters, const Bounds2f &screenWindow,
                       Float lensRadius, Float focalDistance)
        : ProjectiveCamera(baseParameters, Orthographic(0, 1), screenWindow, lensRadius,
                           focalDistance) {
        // Compute differential changes in origin for orthographic camera rays
        dxCamera = cameraFromRaster(Vector3f(1, 0, 0));
        dyCamera = cameraFromRaster(Vector3f(0, 1, 0));

        // Compute minimum differentials for orthographic camera
        minDirDifferentialX = minDirDifferentialY = Vector3f(0, 0, 0);
        minPosDifferentialX = dxCamera;
        minPosDifferentialY = dyCamera;
    }